

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat.cpp
# Opt level: O2

common_chat_tool_choice common_chat_tool_choice_parse_oaicompat(string *tool_choice)

{
  bool bVar1;
  common_chat_tool_choice cVar2;
  runtime_error *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  bVar1 = std::operator==(tool_choice,"auto");
  cVar2 = COMMON_CHAT_TOOL_CHOICE_AUTO;
  if (!bVar1) {
    bVar1 = std::operator==(tool_choice,"none");
    if (bVar1) {
      cVar2 = COMMON_CHAT_TOOL_CHOICE_NONE;
    }
    else {
      bVar1 = std::operator==(tool_choice,"required");
      if (!bVar1) {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::operator+(&bStack_38,"Invalid tool_choice: ",tool_choice);
        std::runtime_error::runtime_error(this,(string *)&bStack_38);
        __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      cVar2 = COMMON_CHAT_TOOL_CHOICE_REQUIRED;
    }
  }
  return cVar2;
}

Assistant:

common_chat_tool_choice common_chat_tool_choice_parse_oaicompat(const std::string & tool_choice) {
    if (tool_choice == "auto") {
        return COMMON_CHAT_TOOL_CHOICE_AUTO;
    }
    if (tool_choice == "none") {
        return COMMON_CHAT_TOOL_CHOICE_NONE;
    }
    if (tool_choice == "required") {
        return COMMON_CHAT_TOOL_CHOICE_REQUIRED;
    }
    throw std::runtime_error("Invalid tool_choice: " + tool_choice);
}